

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector3 Vector3Project(Vector3 v1,Vector3 v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vector3 VVar5;
  
  fVar4 = v2.z;
  fVar2 = v2.x;
  fVar3 = v2.y;
  fVar1 = (v1.z * fVar4 + v1.y * fVar3 + v1.x * fVar2) /
          (fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3);
  VVar5.z = fVar1 * fVar4;
  VVar5.y = fVar3 * fVar1;
  VVar5.x = fVar2 * fVar1;
  return VVar5;
}

Assistant:

RMAPI Vector3 Vector3Project(Vector3 v1, Vector3 v2)
{
    Vector3 result = { 0 };

    float v1dv2 = (v1.x*v2.x + v1.y*v2.y + v1.z*v2.z);
    float v2dv2 = (v2.x*v2.x + v2.y*v2.y + v2.z*v2.z);

    float mag = v1dv2/v2dv2;

    result.x = v2.x*mag;
    result.y = v2.y*mag;
    result.z = v2.z*mag;

    return result;
}